

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeBooleanConstructor
               (DynamicObject *booleanConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *booleanConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,booleanConstructor,mode,3,0);
  this = RecyclableObject::GetScriptContext(&booleanConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&booleanConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,booleanConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).booleanPrototype);
  AddMember(this_00,booleanConstructor,0x124,*ppDVar1,'\0');
  value_00 = ScriptContext::GetPropertyString(this,0x58);
  AddMember(this_00,booleanConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(booleanConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeBooleanConstructor(DynamicObject* booleanConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(booleanConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterBoolean
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = booleanConstructor->GetScriptContext();
        JavascriptLibrary* library = booleanConstructor->GetLibrary();
        library->AddMember(booleanConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(booleanConstructor, PropertyIds::prototype, library->booleanPrototype, PropertyNone);
        library->AddMember(booleanConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Boolean), PropertyConfigurable);

        booleanConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }